

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH_errorcode VELOCYPACK_XXH64_reset(XXH64_state_t *statePtr,XXH64_hash_t seed)

{
  long in_RSI;
  void *in_RDI;
  XXH64_state_t state;
  undefined1 auStack_68 [8];
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_10;
  void *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(auStack_68,0,0x58);
  local_60 = local_10 + 0x60ea27eeadc0b5d6;
  local_58 = local_10 + -0x3d4d51c2d82b14b1;
  local_50 = local_10;
  local_48 = local_10 + 0x61c8864e7a143579;
  memcpy(local_8,auStack_68,0x50);
  return XXH_OK;
}

Assistant:

XXH_PUBLIC_API XXH_errorcode XXH64_reset(XXH64_state_t* statePtr,
                                         XXH64_hash_t seed) {
  XXH64_state_t state; /* use a local state to memcpy() in order to avoid
                          strict-aliasing warnings */
  memset(&state, 0, sizeof(state));
  state.v1 = seed + XXH_PRIME64_1 + XXH_PRIME64_2;
  state.v2 = seed + XXH_PRIME64_2;
  state.v3 = seed + 0;
  state.v4 = seed - XXH_PRIME64_1;
  /* do not write into reserved64, might be removed in a future version */
  memcpy(statePtr, &state, sizeof(state) - sizeof(state.reserved64));
  return XXH_OK;
}